

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O0

TimingOf<std::chrono::_V2::system_clock,_nonius::detail::benchmark_function_&(chronometer)>
nonius::detail::measure_one<std::chrono::_V2::system_clock,nonius::detail::benchmark_function&>
          (undefined8 param_1,int param_2,parameters *param_3)

{
  Duration<std::chrono::_V2::system_clock> DVar1;
  CompleteType<ResultOf<benchmark_function_&(chronometer)>_> *result;
  chronometer_model<std::chrono::_V2::system_clock> meter;
  chronometer *in_stack_ffffffffffffff58;
  chronometer_concept *meter_00;
  chronometer_model<std::chrono::_V2::system_clock> *in_stack_ffffffffffffff70;
  chronometer local_70;
  undefined1 local_51;
  undefined1 *local_50;
  chronometer_concept local_48 [3];
  parameters *local_30;
  int local_24;
  undefined8 local_20;
  TimingOf<std::chrono::_V2::system_clock,_nonius::detail::benchmark_function_&(chronometer)>
  local_10;
  
  meter_00 = local_48;
  local_30 = param_3;
  local_24 = param_2;
  local_20 = param_1;
  chronometer_model<std::chrono::_V2::system_clock>::chronometer_model(in_stack_ffffffffffffff70);
  chronometer::chronometer(&local_70,meter_00,local_24,local_30);
  complete_invoke<nonius::detail::benchmark_function&,nonius::chronometer>
            ((benchmark_function *)meter_00,in_stack_ffffffffffffff58);
  local_50 = &local_51;
  DVar1 = chronometer_model<std::chrono::_V2::system_clock>::elapsed
                    ((chronometer_model<std::chrono::_V2::system_clock> *)in_stack_ffffffffffffff58)
  ;
  timing<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_nonius::detail::complete_type<void>::type>
  ::timing(&local_10,DVar1.__r,local_24);
  chronometer_model<std::chrono::_V2::system_clock>::~chronometer_model
            ((chronometer_model<std::chrono::_V2::system_clock> *)0x24d75d);
  return local_10;
}

Assistant:

TimingOf<Clock, Fun(chronometer)> measure_one(Fun&& fun, int iters, const parameters& params, std::true_type) {
            detail::chronometer_model<Clock> meter;
            auto&& result = detail::complete_invoke(fun, chronometer(meter, iters, params));

            return { meter.elapsed(), std::move(result), iters };
        }